

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_revsurface.cpp
# Opt level: O1

ON_Arc * __thiscall
ON_RevSurface::IsoArc(ON_Arc *__return_storage_ptr__,ON_RevSurface *this,double curve_parameter)

{
  ON_Line *this_00;
  ON_3dVector *this_01;
  ON_Curve *pOVar1;
  double dVar2;
  bool bVar3;
  bool bVar4;
  long lVar5;
  ON_Arc *arc;
  ON_Plane *pOVar6;
  ON_Circle *pOVar7;
  ON_Arc *pOVar8;
  byte bVar9;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  double in_XMM1_Qa;
  ON_3dPoint Q;
  ON_3dPoint P;
  ON_Circle circle;
  ON_3dPoint local_100;
  ON_3dPoint local_e8;
  ON_3dVector local_d0;
  ON_Circle local_b8;
  
  bVar9 = 0;
  pOVar1 = this->m_curve;
  if (pOVar1 != (ON_Curve *)0x0) {
    pOVar6 = &ON_Plane::World_xy;
    pOVar7 = &local_b8;
    for (lVar5 = 0x10; lVar5 != 0; lVar5 = lVar5 + -1) {
      (pOVar7->plane).origin.x = (pOVar6->origin).x;
      pOVar6 = (ON_Plane *)&(pOVar6->origin).y;
      pOVar7 = (ON_Circle *)&(pOVar7->plane).origin.y;
    }
    local_b8.radius = 1.0;
    ON_Curve::PointAt(&local_e8,pOVar1,curve_parameter);
    bVar3 = ON_3dPoint::IsValid(&local_e8);
    if (bVar3) {
      this_00 = &this->m_axis;
      ON_Line::ClosestPointTo(&local_100,this_00,&local_e8);
      local_b8.plane.origin.z = local_100.z;
      local_b8.plane.origin.x = local_100.x;
      local_b8.plane.origin.y = local_100.y;
      ON_Line::Tangent((ON_3dVector *)&local_100,this_00);
      local_b8.plane.zaxis.z = local_100.z;
      local_b8.plane.zaxis.x = local_100.x;
      local_b8.plane.zaxis.y = local_100.y;
      ON_3dPoint::operator-((ON_3dVector *)&local_100,&local_e8,(ON_3dPoint *)&local_b8);
      this_01 = &local_b8.plane.xaxis;
      local_b8.plane.xaxis.z = local_100.z;
      local_b8.plane.xaxis.x = local_100.x;
      local_b8.plane.xaxis.y = local_100.y;
      local_b8.radius = ON_3dVector::Length(this_01);
      bVar4 = ON_3dVector::Unitize(this_01);
      if (!bVar4) {
        pOVar1 = this->m_curve;
        (*(pOVar1->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x25])(pOVar1);
        local_d0.x = (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
        local_d0.y = in_XMM1_Qa;
        dVar2 = ON_Interval::ParameterAt((ON_Interval *)&local_d0,0.5);
        ON_Curve::PointAt(&local_100,pOVar1,dVar2);
        local_e8.z = local_100.z;
        local_e8.x = local_100.x;
        local_e8.y = local_100.y;
        ON_Line::ClosestPointTo(&local_100,this_00,&local_e8);
        ON_3dPoint::operator-(&local_d0,&local_e8,&local_100);
        local_b8.plane.xaxis.z = local_d0.z;
        local_b8.plane.xaxis.x = local_d0.x;
        local_b8.plane.xaxis.y = local_d0.y;
        bVar4 = ON_3dVector::Unitize(this_01);
        if (!bVar4) {
          ON_3dVector::PerpendicularTo(this_01,&local_b8.plane.zaxis);
        }
      }
      ON_CrossProduct((ON_3dVector *)&local_100,&local_b8.plane.zaxis,this_01);
      local_b8.plane.yaxis.z = local_100.z;
      local_b8.plane.yaxis.x = local_100.x;
      local_b8.plane.yaxis.y = local_100.y;
      ON_3dVector::Unitize(&local_b8.plane.yaxis);
      ON_Plane::UpdateEquation(&local_b8.plane);
      ON_Arc::ON_Arc(__return_storage_ptr__,&local_b8,(ON_Interval)*&(this->m_angle).m_t);
      ON_Plane::~ON_Plane(&local_b8.plane);
      if (bVar3) {
        return __return_storage_ptr__;
      }
    }
    else {
      ON_Plane::~ON_Plane(&local_b8.plane);
    }
  }
  pOVar6 = &ON_Plane::World_xy;
  pOVar8 = __return_storage_ptr__;
  for (lVar5 = 0x10; lVar5 != 0; lVar5 = lVar5 + -1) {
    (pOVar8->super_ON_Circle).plane.origin.x = (pOVar6->origin).x;
    pOVar6 = (ON_Plane *)((long)pOVar6 + ((ulong)bVar9 * -2 + 1) * 8);
    pOVar8 = (ON_Arc *)((long)pOVar8 + (ulong)bVar9 * -0x10 + 8);
  }
  (__return_storage_ptr__->super_ON_Circle).radius = 1.0;
  dVar2 = ON_Interval::ZeroToTwoPi.m_t[1];
  (__return_storage_ptr__->m_angle).m_t[0] = ON_Interval::ZeroToTwoPi.m_t[0];
  (__return_storage_ptr__->m_angle).m_t[1] = dVar2;
  pOVar6 = &ON_Plane::NanPlane;
  pOVar8 = __return_storage_ptr__;
  for (lVar5 = 0x10; lVar5 != 0; lVar5 = lVar5 + -1) {
    (pOVar8->super_ON_Circle).plane.origin.x = (pOVar6->origin).x;
    pOVar6 = (ON_Plane *)((long)pOVar6 + ((ulong)bVar9 * -2 + 1) * 8);
    pOVar8 = (ON_Arc *)((long)pOVar8 + (ulong)bVar9 * -0x10 + 8);
  }
  (__return_storage_ptr__->super_ON_Circle).radius = ON_DBL_QNAN;
  return __return_storage_ptr__;
}

Assistant:

ON_Arc ON_RevSurface::IsoArc(
  double curve_parameter
) const
{
  for (;;)
  {
    if (nullptr == m_curve)
      break;
    // 8 December 2003 Chuck - fix iso extraction bug
    //   when m_angle[0] != 0.
    ON_Circle circle;
    ON_3dPoint P = m_curve->PointAt(curve_parameter);
    if (false == P.IsValid())
      break;
    circle.plane.origin = m_axis.ClosestPointTo(P);
    circle.plane.zaxis = m_axis.Tangent();
    circle.plane.xaxis = P - circle.plane.origin;
    circle.radius = circle.plane.xaxis.Length();
    if (!circle.plane.xaxis.Unitize())
    {
      // 8 December 2003 Dale Lear - get valid zero radius
      //   arc/circle when revolute hits the axis.
      // First: try middle of revolute for x-axis
      P = m_curve->PointAt(m_curve->Domain().ParameterAt(0.5));
      ON_3dPoint Q = m_axis.ClosestPointTo(P);
      circle.plane.xaxis = P - Q;
      if (!circle.plane.xaxis.Unitize())
      {
        // Then: just use a vector perp to zaxis
        circle.plane.xaxis.PerpendicularTo(circle.plane.zaxis);
      }
    }
    circle.plane.yaxis = ON_CrossProduct(circle.plane.zaxis, circle.plane.xaxis);
    circle.plane.yaxis.Unitize();
    circle.plane.UpdateEquation();
    ON_Arc arc(circle, m_angle);
    return arc;
  }
  ON_Arc arc;
  arc.plane = ON_Plane::NanPlane;
  arc.radius = ON_DBL_QNAN;
  return arc;
}